

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

TokenList * scanTokens(void)

{
  Token t_00;
  Token t_01;
  TokenList *pTVar1;
  undefined8 in_stack_ffffffffffffff68;
  char *local_90;
  char *local_88;
  undefined8 local_80;
  int local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  Token t;
  TokenList *head;
  TokenList *ret;
  
  head = (TokenList *)0x0;
  t.length = 0;
  t.line = 0;
  while( true ) {
    scanToken();
    if (local_78 == 0x3d) break;
    t_00.start = (char *)local_68;
    t_00._0_8_ = local_70;
    t_00.file = (char *)local_60;
    t_00.length = (TokenType)in_stack_ffffffffffffff68;
    t_00.line = SUB84(in_stack_ffffffffffffff68,4);
    pTVar1 = newList(t_00);
    insertList((TokenList **)&t.length,&head,pTVar1);
  }
  makeToken((Token *)&stack0xffffffffffffff68,TOKEN_EOF);
  t_01.start = local_88;
  t_01._0_8_ = local_90;
  t_01.file = (char *)local_80;
  t_01.length = (TokenType)in_stack_ffffffffffffff68;
  t_01.line = SUB84(in_stack_ffffffffffffff68,4);
  pTVar1 = newList(t_01);
  insertList((TokenList **)&t.length,&head,pTVar1);
  return (TokenList *)t._24_8_;
}

Assistant:

TokenList* scanTokens(){
    TokenList *ret = NULL, *head = NULL;
    Token t;
    while((t = scanToken()).type != TOKEN_EOF){
        //info("Looping in makelist");
        insertList(&head, &ret, newList(t));
    }

    insertList(&head, &ret, newList(makeToken(TOKEN_EOF)));

    return head;
}